

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O2

void __thiscall
COLLADASaxFWL::KinematicsScene::KinematicsScene(KinematicsScene *this,URI *uri,String *name)

{
  *(undefined ***)this = &PTR__KinematicsScene_009539b8;
  COLLADABU::URI::URI(&this->mUri,uri,false);
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  (this->mKinematicsInstanceArticulatedSystems).
  super__Vector_base<COLLADASaxFWL::KinematicsInstanceArticulatedSystem_*,_std::allocator<COLLADASaxFWL::KinematicsInstanceArticulatedSystem_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mKinematicsInstanceArticulatedSystems).
  super__Vector_base<COLLADASaxFWL::KinematicsInstanceArticulatedSystem_*,_std::allocator<COLLADASaxFWL::KinematicsInstanceArticulatedSystem_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mKinematicsInstanceArticulatedSystems).
  super__Vector_base<COLLADASaxFWL::KinematicsInstanceArticulatedSystem_*,_std::allocator<COLLADASaxFWL::KinematicsInstanceArticulatedSystem_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mKinematicsInstanceKinematicsModels).
  super__List_base<COLLADASaxFWL::KinematicsInstanceKinematicsModel,_std::allocator<COLLADASaxFWL::KinematicsInstanceKinematicsModel>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->mKinematicsInstanceKinematicsModels;
  (this->mKinematicsInstanceKinematicsModels).
  super__List_base<COLLADASaxFWL::KinematicsInstanceKinematicsModel,_std::allocator<COLLADASaxFWL::KinematicsInstanceKinematicsModel>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->mKinematicsInstanceKinematicsModels;
  (this->mKinematicsInstanceKinematicsModels).
  super__List_base<COLLADASaxFWL::KinematicsInstanceKinematicsModel,_std::allocator<COLLADASaxFWL::KinematicsInstanceKinematicsModel>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

KinematicsScene(const COLLADABU::URI& uri, const String& name )
			: mUri( uri ), mName(name) {}